

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::EmitFunctionBody(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  OpCode OVar1;
  ushort uVar2;
  SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  ParseNode *pPVar4;
  Symbol *sym;
  code *pcVar5;
  FuncInfo *pFVar6;
  bool bVar7;
  uint sourceContextId;
  LocalFunctionId functionId;
  undefined4 *puVar8;
  ParseNodeBin *pPVar9;
  CapturedSymMap *this_00;
  Type *ppSVar10;
  Type pSVar11;
  ParseNodePtr stmt_00;
  ParseNodePtr local_58;
  ParseNode *stmt;
  SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *local_48;
  ByteCodeGenerator *local_40;
  FuncInfo *local_38;
  
  stmt_00 = funcInfo->root->pnodeBody;
  local_40 = this;
  local_38 = funcInfo;
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  pFVar6 = local_38;
  while (stmt_00->nop == knopList) {
    pPVar9 = ParseNode::AsParseNodeBin(stmt_00);
    local_58 = pPVar9->pnode1;
    if ((local_58->grfpn & 0x4000) != 0) {
      this_00 = FuncInfo::EnsureCapturedSymMap(local_38);
      stmt = (ParseNode *)
             JsUtil::
             BaseDictionary<ParseNode_*,_SList<Symbol_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Item(this_00,&local_58);
      local_48 = (SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)stmt;
      while( true ) {
        if (local_48 == (SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_0076042d;
          *puVar8 = 0;
        }
        pSVar3 = (SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)
                 (local_48->super_SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
        if (pSVar3 == (SList<Symbol_*,_Memory::ArenaAllocator,_RealCount> *)stmt) break;
        local_48 = pSVar3;
        ppSVar10 = SListBase<Symbol_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)&stmt);
        bVar7 = Symbol::GetIsCommittedToSlot(*ppSVar10);
        if (!bVar7) {
          pSVar11 = *ppSVar10;
          if (pSVar11->location == 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x9e9,"(sym->GetLocation() != Js::Constants::NoProperty)",
                               "sym->GetLocation() != Js::Constants::NoProperty");
            if (!bVar7) goto LAB_0076042d;
            *puVar8 = 0;
            pSVar11 = *ppSVar10;
          }
          pSVar11->field_0x43 = pSVar11->field_0x43 | 4;
          pPVar4 = (*ppSVar10)->decl;
          if (pPVar4 == (ParseNode *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar7 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x9ec,"(decl)","decl");
            if (!bVar7) goto LAB_0076042d;
            *puVar8 = 0;
          }
          sourceContextId =
               Js::FunctionProxy::GetSourceContextId(&pFVar6->byteCodeFunction->super_FunctionProxy)
          ;
          functionId = Js::FunctionProxy::GetLocalFunctionId
                                 (&pFVar6->byteCodeFunction->super_FunctionProxy);
          bVar7 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01453738,DelayCapturePhase,sourceContextId,functionId);
          if (bVar7) {
            Output::Print(L"--- DelayCapture: Committed symbol \'%s\' to slot.\n",
                          ((*ppSVar10)->name).string.ptr);
            Output::Flush();
          }
          uVar2 = *(ushort *)&(*ppSVar10)->field_0x42;
          *(ushort *)&(*ppSVar10)->field_0x42 = uVar2 & 0xfffe;
          sym = *ppSVar10;
          OVar1 = pPVar4->nop;
          EmitPropStore(local_40,sym->location,sym,sym->pid,local_38,OVar1 == knopLetDecl,
                        OVar1 == knopConstDecl,false,false);
          *(ushort *)&(*ppSVar10)->field_0x42 =
               *(ushort *)&(*ppSVar10)->field_0x42 & 0xfffe | uVar2 & 1;
        }
      }
    }
    EmitTopLevelStatement(local_40,local_58,local_38,0);
    pPVar9 = ParseNode::AsParseNodeBin(stmt_00);
    stmt_00 = pPVar9->pnode2;
  }
  if ((stmt_00->grfpn & 0x4000) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xa00,"(!pnode->CapturesSyms())","!pnode->CapturesSyms()");
    if (!bVar7) {
LAB_0076042d:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  EmitTopLevelStatement(local_40,stmt_00,local_38,0);
  return;
}

Assistant:

void ByteCodeGenerator::EmitFunctionBody(FuncInfo *funcInfo)
{
    // Emit a function body. Only explicit returns and the implicit "undef" at the bottom
    // get copied to the return register.
    ParseNode *pnodeBody = funcInfo->root->pnodeBody;
    ParseNode *pnode = pnodeBody;
    while (pnode->nop == knopList)
    {
        ParseNode *stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt->CapturesSyms())
        {
            CapturedSymMap *map = funcInfo->EnsureCapturedSymMap();
            SList<Symbol*> *list = map->Item(stmt);
            FOREACH_SLIST_ENTRY(Symbol*, sym, list)
            {
                if (!sym->GetIsCommittedToSlot())
                {
                    Assert(sym->GetLocation() != Js::Constants::NoProperty);
                    sym->SetIsCommittedToSlot();
                    ParseNode *decl = sym->GetDecl();
                    Assert(decl);
                    if (PHASE_TRACE(Js::DelayCapturePhase, funcInfo->byteCodeFunction))
                    {
                        Output::Print(_u("--- DelayCapture: Committed symbol '%s' to slot.\n"),
                            sym->GetName().GetBuffer());
                        Output::Flush();
                    }
                    // REVIEW[ianhall]: HACK to work around this causing an error due to sym not yet being initialized
                    // what is this doing? Why are we assigning sym to itself?
                    bool old = sym->GetNeedDeclaration();
                    sym->SetNeedDeclaration(false);
                    this->EmitPropStore(sym->GetLocation(), sym, sym->GetPid(), funcInfo, decl->nop == knopLetDecl, decl->nop == knopConstDecl);
                    sym->SetNeedDeclaration(old);
                }
            }
            NEXT_SLIST_ENTRY;
        }
        EmitTopLevelStatement(stmt, funcInfo, false);
        pnode = pnode->AsParseNodeBin()->pnode2;
    }
    Assert(!pnode->CapturesSyms());
    EmitTopLevelStatement(pnode, funcInfo, false);
}